

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low-level.cpp
# Opt level: O0

void __thiscall spatial_region::create_arrays(spatial_region *this,int nx0,int ny0,int nz0,int seed)

{
  int iVar1;
  vector<field3d<double>,_std::allocator<field3d<double>_>_> *__x;
  void *pvVar2;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  uint in_R8D;
  int i_1;
  int i;
  int n;
  void *pv;
  field3d<cellb> *in_stack_fffffffffffffe68;
  field3d<cellb> *in_stack_fffffffffffffe70;
  field3d<double> *this_00;
  allocator_type *__a;
  undefined1 *__n;
  vector<field3d<double>,_std::allocator<field3d<double>_>_> *this_01;
  int local_148;
  int local_144;
  field3d<double> local_140;
  int local_118;
  allocator_type local_111 [25];
  undefined1 local_f8 [12];
  int in_stack_ffffffffffffff14;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  field3d<cellb> *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff34;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  field3d<cellp> *in_stack_ffffffffffffff40;
  
  *in_RDI = in_ESI;
  in_RDI[1] = in_EDX;
  in_RDI[2] = in_ECX;
  field3d<celle>::field3d
            ((field3d<celle> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
             in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
  field3d<celle>::operator=
            ((field3d<celle> *)in_stack_fffffffffffffe70,(field3d<celle> *)in_stack_fffffffffffffe68
            );
  field3d<celle>::~field3d((field3d<celle> *)in_stack_fffffffffffffe70);
  field3d<cellb>::field3d
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
             in_stack_ffffffffffffff14);
  field3d<cellb>::operator=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  field3d<cellb>::~field3d(in_stack_fffffffffffffe70);
  field3d<cellj>::field3d
            ((field3d<cellj> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
             in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
  field3d<cellj>::operator=
            ((field3d<cellj> *)in_stack_fffffffffffffe70,(field3d<cellj> *)in_stack_fffffffffffffe68
            );
  field3d<cellj>::~field3d((field3d<cellj> *)in_stack_fffffffffffffe70);
  this_01 = (vector<field3d<double>,_std::allocator<field3d<double>_>_> *)&stack0xffffffffffffff30;
  field3d<cellbe>::field3d
            ((field3d<cellbe> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
             in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
  field3d<cellbe>::operator=
            ((field3d<cellbe> *)in_stack_fffffffffffffe70,
             (field3d<cellbe> *)in_stack_fffffffffffffe68);
  field3d<cellbe>::~field3d((field3d<cellbe> *)in_stack_fffffffffffffe70);
  __n = local_f8;
  field3d<cellp>::field3d
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff34);
  field3d<cellp>::operator=
            ((field3d<cellp> *)in_stack_fffffffffffffe70,(field3d<cellp> *)in_stack_fffffffffffffe68
            );
  field3d<cellp>::~field3d((field3d<cellp> *)in_stack_fffffffffffffe70);
  __x = (vector<field3d<double>,_std::allocator<field3d<double>_>_> *)(long)(int)in_RDI[0x16];
  __a = local_111;
  std::allocator<field3d<double>_>::allocator((allocator<field3d<double>_> *)0x1335e5);
  std::vector<field3d<double>,_std::allocator<field3d<double>_>_>::vector
            (this_01,(size_type)__n,__a);
  std::vector<field3d<double>,_std::allocator<field3d<double>_>_>::operator=
            ((vector<field3d<double>,_std::allocator<field3d<double>_>_> *)__a,__x);
  std::vector<field3d<double>,_std::allocator<field3d<double>_>_>::~vector
            ((vector<field3d<double>,_std::allocator<field3d<double>_>_> *)__a);
  std::allocator<field3d<double>_>::~allocator((allocator<field3d<double>_> *)0x133631);
  for (local_118 = 0; local_118 < (int)in_RDI[0x16]; local_118 = local_118 + 1) {
    this_00 = &local_140;
    field3d<double>::field3d
              ((field3d<double> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
               in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
    std::vector<field3d<double>,_std::allocator<field3d<double>_>_>::operator[]
              ((vector<field3d<double>,_std::allocator<field3d<double>_>_> *)(in_RDI + 0x8c),
               (long)local_118);
    field3d<double>::operator=(this_00,(field3d<double> *)in_stack_fffffffffffffe68);
    field3d<double>::~field3d(this_00);
  }
  pvVar2 = malloc(0x1b8);
  *(void **)(in_RDI + 0x12) = pvVar2;
  srand(in_R8D);
  for (local_144 = 0; local_144 < 0x37; local_144 = local_144 + 1) {
    iVar1 = rand();
    *(double *)(*(long *)(in_RDI + 0x12) + (long)local_144 * 8) = (double)iVar1 / 2147483647.0;
  }
  pvVar2 = malloc((long)(int)in_RDI[0x16] << 3);
  *(void **)(in_RDI + 0x40) = pvVar2;
  pvVar2 = malloc((long)(int)in_RDI[0x16] << 3);
  *(void **)(in_RDI + 0x48) = pvVar2;
  for (local_148 = 0; local_148 < (int)in_RDI[0x16]; local_148 = local_148 + 1) {
    *(undefined8 *)(*(long *)(in_RDI + 0x48) + (long)local_148 * 8) = 0;
  }
  pvVar2 = malloc((long)(int)in_RDI[0x16] << 2);
  *(void **)(in_RDI + 0x36) = pvVar2;
  return;
}

Assistant:

void spatial_region::create_arrays(int nx0, int ny0, int nz0, int seed)
{
    nx = nx0;
    ny = ny0;
    nz = nz0;

    void* pv;

    ce = field3d<celle>(nx, ny, nz);
    cb = field3d<cellb>(nx, ny, nz);
    cj = field3d<cellj>(nx, ny, nz);
    cbe = field3d<cellbe>(nx, ny, nz);
    cp = field3d<cellp>(nx, ny, nz);

    irho = vector<field3d<double> >(n_ion_populations);
    for (int n=0;n<n_ion_populations;n++)
    {
        irho[n] = field3d<double>(nx, ny, nz);
    }

    pv = malloc(sizeof(double)*55);
    random = (double*) pv;
    srand(seed);
    for(int i=0;i<55;i++)
    {
        random[i] = (double)rand()/(double)RAND_MAX;
    }

    pv = malloc(sizeof(double)*n_ion_populations);
    ienergy = (double*) pv;
    pv = malloc(sizeof(double)*n_ion_populations);
    ienergy_deleted = (double*) pv;
    for (int i=0; i<n_ion_populations; ++i)
    {
        ienergy_deleted[i] = 0.0;
    }

    pv = malloc(sizeof(int)*n_ion_populations);
    N_qp_i = (int*) pv;
}